

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BEREncode.cpp
# Opt level: O1

int __thiscall IntegerType::serialise(IntegerType *this,uint8_t *buf,size_t max_len)

{
  uint uVar1;
  
  uVar1 = 0xffffffe1;
  if (1 < max_len) {
    *buf = (char)(this->super_BER_CONTAINER)._type;
    buf[1] = '\x04';
    uVar1 = 0xffffffe1;
    if (5 < max_len) {
      uVar1 = 2;
    }
  }
  if (-1 < (int)uVar1) {
    buf[uVar1] = *(uint8_t *)((long)&this->_value + 3);
    buf[(ulong)uVar1 + 1] = *(uint8_t *)((long)&this->_value + 2);
    buf[(ulong)uVar1 + 2] = *(uint8_t *)((long)&this->_value + 1);
    buf[(ulong)uVar1 + 3] = (uint8_t)this->_value;
    uVar1 = uVar1 + 4;
  }
  return uVar1;
}

Assistant:

int IntegerType::serialise(uint8_t* buf, size_t max_len){
    int i = BER_CONTAINER::serialise(buf, max_len, 4);
    CHECK_ENCODE_ERR(i);
    uint8_t *ptr = buf + i;

    *ptr++ = _value >> 24 & 0xFF;
    *ptr++ = _value >> 16 & 0xFF;
    *ptr++ = _value >> 8 & 0xFF;
    *ptr++ = _value & 0xFF;
    
    return ptr - buf;
}